

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *
kratos::extract_event_info
          (vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *__return_storage_ptr__,
          Generator *top)

{
  undefined1 local_78 [8];
  EventVisitor visitor;
  Generator *top_local;
  
  visitor.info.super__Vector_base<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)top;
  EventVisitor::EventVisitor((EventVisitor *)local_78);
  IRVisitor::visit_root
            ((IRVisitor *)local_78,
             (IRNode *)
             visitor.info.super__Vector_base<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>::vector
            (__return_storage_ptr__,
             (vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *)
             &visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  EventVisitor::~EventVisitor((EventVisitor *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EventInfo> extract_event_info(Generator *top) {
    EventVisitor visitor;
    visitor.visit_root(top);
    return visitor.info;
}